

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::DropDirectoryItem
          (cmComputeLinkInformation *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item
          )

{
  cmake *this_00;
  string *b;
  string local_38;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_18;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item_local;
  cmComputeLinkInformation *this_local;
  
  this_00 = this->CMakeInstance;
  local_18 = item;
  item_local = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  b = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[34],std::__cxx11::string_const&,char_const(&)[69]>
            (&local_38,(char (*) [9])0xfe8cbd,b,(char (*) [34])"\" requests linking to directory \""
             ,&local_18->Value,
             (char (*) [69])"\".  Targets may link only to libraries.  CMake is dropping the item.")
  ;
  cmake::IssueMessage(this_00,WARNING,&local_38,&local_18->Backtrace);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(BT<std::string> const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  this->CMakeInstance->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Target \"", this->Target->GetName(),
             "\" requests linking to directory \"", item.Value,
             "\".  Targets may link only to libraries.  CMake is dropping "
             "the item."),
    item.Backtrace);
}